

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRHS.cpp
# Opt level: O1

void __thiscall
HEkkDualRHS::chooseMultiGlobal
          (HEkkDualRHS *this,HighsInt *chIndex,HighsInt *chCount,HighsInt chLimit)

{
  double dVar1;
  double dVar2;
  HEkk *pHVar3;
  uint uVar4;
  HighsInt *pHVar5;
  HighsInt *pHVar6;
  uint32_t uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  uint32_t uVar12;
  long lVar13;
  uint32_t uVar14;
  bool bVar15;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> setP;
  uint32_t local_9c;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> local_98;
  uint32_t local_74;
  size_type local_70;
  pair<double,_int> local_68;
  double local_58;
  undefined8 uStack_50;
  ulong local_48;
  HighsInt *local_40;
  HighsInt *local_38;
  
  uVar8 = (ulong)(uint)chLimit;
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x26,0);
  if (0 < chLimit) {
    memset(chIndex,0xff,(ulong)(uint)chLimit << 2);
  }
  uVar9 = (ulong)(uint)(chLimit * 2);
  local_98.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pair<double,_int> *)0x0;
  local_98.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pair<double,_int> *)0x0;
  local_98.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pair<double,_int> *)0x0;
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::reserve
            (&local_98,uVar9);
  pHVar3 = this->ekk_instance_;
  uVar14 = this->workCount;
  local_70 = (size_type)chLimit;
  local_48 = uVar8;
  local_40 = chCount;
  local_38 = chIndex;
  if ((int)uVar14 < 0) {
    local_74 = 0;
    if (uVar14 != 0xffffffff) {
      uVar4 = 0x1f;
      if (~uVar14 != 0) {
        for (; ~uVar14 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      local_74 = HighsRandom::drawUniform(&pHVar3->random_,-uVar14,(uVar4 ^ 0xffffffe0) + 0x21);
    }
    local_58 = 0.0;
    uStack_50 = 0;
    iVar11 = 0;
    do {
      uVar12 = local_74;
      uVar7 = 0;
      if (iVar11 == 0) {
        uVar12 = -uVar14;
        uVar7 = local_74;
      }
      if ((int)uVar7 < (int)uVar12) {
        lVar13 = (long)(int)uVar7;
        do {
          dVar1 = (this->work_infeasibility).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar13];
          if ((1e-50 < dVar1) &&
             (dVar2 = (pHVar3->dual_edge_weight_).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar13], local_58 * dVar2 < dVar1)) {
            local_68.first = -dVar1 / dVar2;
            local_68.second = (int)lVar13;
            if (local_98.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_98.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
              _M_realloc_insert<std::pair<double,int>>
                        ((vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *)
                         &local_98,
                         (iterator)
                         local_98.
                         super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_68);
            }
            else {
              (local_98.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish)->first = local_68.first;
              *(ulong *)&(local_98.
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->second =
                   CONCAT44(local_68._12_4_,local_68.second);
              local_98.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_98.
                   super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            uVar8 = (long)local_98.
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_98.
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4;
            if (uVar9 <= uVar8) {
              if (local_98.
                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  local_98.
                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                iVar10 = 0;
                if (1 < uVar8) {
                  iVar10 = 0;
                  do {
                    uVar8 = (long)uVar8 >> 1;
                    iVar10 = iVar10 + 1;
                  } while (1 < uVar8);
                }
                pdqsort_detail::
                pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>,false>
                          (local_98.
                           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_98.
                           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,iVar10,1);
              }
              std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::resize
                        (&local_98,local_70);
              local_58 = -local_98.
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1].first;
              uStack_50 = 0x8000000000000000;
            }
          }
          lVar13 = lVar13 + 1;
        } while (uVar12 != (uint32_t)lVar13);
      }
      bVar15 = iVar11 == 0;
      iVar11 = iVar11 + 1;
    } while (bVar15);
  }
  else {
    local_9c = 0;
    if (1 < (int)uVar14) {
      uVar4 = 0x1f;
      if (uVar14 - 1 != 0) {
        for (; uVar14 - 1 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      local_9c = HighsRandom::drawUniform(&pHVar3->random_,uVar14,(uVar4 ^ 0xffffffe0) + 0x21);
    }
    local_58 = 0.0;
    uStack_50 = 0;
    iVar11 = 0;
    do {
      uVar14 = local_9c;
      uVar7 = 0;
      if (iVar11 == 0) {
        uVar14 = this->workCount;
        uVar7 = local_9c;
      }
      if ((int)uVar7 < (int)uVar14) {
        lVar13 = (long)(int)uVar7;
        do {
          iVar10 = (this->workIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar13];
          dVar1 = (this->work_infeasibility).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[iVar10];
          if ((1e-50 < dVar1) &&
             (dVar2 = (pHVar3->dual_edge_weight_).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar10], local_58 * dVar2 < dVar1)) {
            local_68.first = -dVar1 / dVar2;
            local_68.second = iVar10;
            if (local_98.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_98.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
              _M_realloc_insert<std::pair<double,int>>
                        ((vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *)
                         &local_98,
                         (iterator)
                         local_98.
                         super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_68);
            }
            else {
              (local_98.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish)->first = local_68.first;
              *(ulong *)&(local_98.
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->second =
                   CONCAT44(local_68._12_4_,iVar10);
              local_98.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_98.
                   super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            uVar8 = (long)local_98.
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_98.
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4;
            if (uVar9 <= uVar8) {
              if (local_98.
                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  local_98.
                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                iVar10 = 0;
                if (1 < uVar8) {
                  iVar10 = 0;
                  do {
                    uVar8 = (long)uVar8 >> 1;
                    iVar10 = iVar10 + 1;
                  } while (1 < uVar8);
                }
                pdqsort_detail::
                pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>,false>
                          (local_98.
                           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_98.
                           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,iVar10,1);
              }
              std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::resize
                        (&local_98,local_70);
              local_58 = -local_98.
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1].first;
              uStack_50 = 0x8000000000000000;
            }
          }
          lVar13 = lVar13 + 1;
        } while (uVar14 != (uint32_t)lVar13);
      }
      bVar15 = iVar11 == 0;
      iVar11 = iVar11 + 1;
    } while (bVar15);
  }
  pHVar6 = local_38;
  pHVar5 = local_40;
  uVar8 = local_48;
  if (local_98.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_98.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    uVar9 = (long)local_98.
                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_98.
                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    iVar11 = 0;
    if (1 < uVar9) {
      iVar11 = 0;
      do {
        uVar9 = (long)uVar9 >> 1;
        iVar11 = iVar11 + 1;
      } while (1 < uVar9);
    }
    pdqsort_detail::
    pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>,false>
              (local_98.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_98.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,iVar11,1);
  }
  if ((int)uVar8 <
      (int)((ulong)((long)local_98.
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_98.
                         super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
    std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::resize
              (&local_98,local_70);
  }
  uVar8 = (long)local_98.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_98.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4;
  *pHVar5 = (HighsInt)uVar8;
  if (local_98.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_98.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar13 = 0;
    uVar9 = 1;
    do {
      *(int *)((long)pHVar6 + lVar13) =
           (&(local_98.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start)->second)[lVar13];
      lVar13 = lVar13 + 4;
      bVar15 = uVar9 < uVar8;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar15);
  }
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x26,0);
  if (local_98.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pair<double,_int> *)0x0) {
    operator_delete(local_98.
                    super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HEkkDualRHS::chooseMultiGlobal(HighsInt* chIndex, HighsInt* chCount,
                                    HighsInt chLimit) {
  analysis->simplexTimerStart(ChuzrDualClock);

  for (HighsInt i = 0; i < chLimit; i++) chIndex[i] = -1;

  const HighsUInt chooseCHECK = chLimit * 2;
  vector<pair<double, int>> setP;
  setP.reserve(chooseCHECK);

  std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
  if (workCount < 0) {
    // DENSE mode
    const HighsInt numRow = -workCount;
    HighsInt randomStart = ekk_instance_.random_.integer(numRow);
    double cutoffMerit = 0;
    // Now
    for (HighsInt section = 0; section < 2; section++) {
      const HighsInt start = (section == 0) ? randomStart : 0;
      const HighsInt end = (section == 0) ? numRow : randomStart;
      for (HighsInt iRow = start; iRow < end; iRow++) {
        // Was
        //    for (HighsInt iRow = 0; iRow < numRow; iRow++) {
        // Continue
        if (work_infeasibility[iRow] > kHighsZero) {
          const double myInfeas = work_infeasibility[iRow];
          const double myWeight = edge_weight[iRow];
          if (cutoffMerit * myWeight < myInfeas) {
            // Save
            setP.push_back(make_pair(-myInfeas / myWeight, iRow));
            // Shrink
            if (setP.size() >= chooseCHECK) {
              pdqsort(setP.begin(), setP.end());
              setP.resize(chLimit);
              cutoffMerit = -setP.back().first;
            }
          }
        }
      }
    }
  } else {
    // SPARSE Mode
    HighsInt randomStart;
    if (workCount) {
      randomStart = ekk_instance_.random_.integer(workCount);
    } else {
      // workCount = 0
      randomStart = 0;
    }
    double cutoffMerit = 0;
    // Now
    for (HighsInt section = 0; section < 2; section++) {
      const HighsInt start = (section == 0) ? randomStart : 0;
      const HighsInt end = (section == 0) ? workCount : randomStart;
      for (HighsInt i = start; i < end; i++) {
        // Was
        //    for (HighsInt i = 0; i < workCount; i++) {
        // Continue
        HighsInt iRow = workIndex[i];
        if (work_infeasibility[iRow] > kHighsZero) {
          const double myInfeas = work_infeasibility[iRow];
          const double myWeight = edge_weight[iRow];
          /*
          const double myMerit = myInfeas / myWeight;
          printf("CHUZR: iRow = %6" HIGHSINT_FORMAT "; Infeas = %11.4g; Weight =
          %11.4g; Merit = %11.4g\n", iRow, myInfeas, myWeight, myMerit);
          */
          if (cutoffMerit * myWeight < myInfeas) {
            // Save
            setP.push_back(make_pair(-myInfeas / myWeight, iRow));
            // Shrink
            if (setP.size() >= chooseCHECK) {
              pdqsort(setP.begin(), setP.end());
              setP.resize(chLimit);
              cutoffMerit = -setP.back().first;
            }
          }
        }
      }
    }
  }

  // Store the setP
  pdqsort(setP.begin(), setP.end());
  if ((HighsInt)(setP.size()) > chLimit) setP.resize(chLimit);
  *chCount = setP.size();
  for (unsigned i = 0; i < setP.size(); i++) chIndex[i] = setP[i].second;
  analysis->simplexTimerStop(ChuzrDualClock);
}